

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

void InitAutomate(char *autotab,uchar *def)

{
  int local_1c;
  int i;
  uchar *def_local;
  char *autotab_local;
  
  memset(autotab,0,0x100);
  for (local_1c = 0; def[local_1c] != '\0'; local_1c = local_1c + 1) {
    autotab[(int)(uint)def[local_1c]] = '\x01';
  }
  return;
}

Assistant:

void InitAutomate(char *autotab, const unsigned char *def)
{
	#undef FUNC
	#define FUNC "InitAutomate"

	int i;

	memset(autotab,0,256);
	for (i=0;def[i];i++) {
		autotab[(int)def[i]]=1;
	}
}